

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_ffi_dapi.cpp
# Opt level: O3

void tqapi_dapi_free_get_bars_result(DataApi *dapi,GetBarResult *result)

{
  GetBarResultData *pGVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  
  if (result != (GetBarResult *)0x0) {
    pGVar1 = result->data;
    if (pGVar1 != (GetBarResultData *)0x0) {
      pcVar2 = (pGVar1->result).msg._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &(pGVar1->result).msg.field_2) {
        operator_delete(pcVar2);
      }
      this = (pGVar1->result).value.
             super___shared_ptr<const_tquant::api::_TickArray<tquant::api::RawBar>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
    }
    operator_delete(pGVar1);
    operator_delete(result);
    return;
  }
  return;
}

Assistant:

void tqapi_dapi_free_get_bars_result(DataApi* dapi, GetBarResult* result)
    {
        if (result) {
            delete result->data;
            delete result;
        }
    }